

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *str;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  this;
  size_t sVar2;
  Int32 result;
  Int32 local_34;
  Message local_30;
  
  str = getenv(var);
  if (str != (char *)0x0) {
    this.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                operator_new(0x188);
    std::__cxx11::stringstream::stringstream((stringstream *)this.ptr_);
    *(undefined8 *)(this.ptr_ + *(long *)(*(long *)(this.ptr_ + 0x10) + -0x18) + 0x18) = 0x11;
    local_30.ss_.ptr_ =
         (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )this.ptr_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(this.ptr_ + 0x10),"The value of environment variable ",0x22);
    if (var == (char *)0x0) {
      var = "(null)";
      sVar2 = 6;
    }
    else {
      sVar2 = strlen(var);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this.ptr_ + 0x10),var,sVar2);
    bVar1 = ParseInt32(&local_30,str,&local_34);
    (**(code **)(*(long *)this.ptr_ + 8))(this.ptr_);
    default_val = local_34;
    if (!bVar1) {
      exit(1);
    }
  }
  return default_val;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}